

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Reader::Init(BP5Reader *this)

{
  ulong uVar1;
  char *pcVar2;
  long *in_RDI;
  TimePoint timeoutInstant;
  Seconds pollSeconds;
  Seconds timeoutSeconds;
  string *in_stack_000003b8;
  RangeFilter *in_stack_000003c0;
  Seconds *in_stack_00000538;
  Seconds *in_stack_00000540;
  TimePoint *in_stack_00000548;
  BP5Reader *in_stack_00000550;
  Seconds *in_stack_00000688;
  Seconds *in_stack_00000690;
  TimePoint *in_stack_00000698;
  BP5Reader *in_stack_000006a0;
  duration<double,_std::ratio<1L,_1L>_> *in_stack_fffffffffffffef8;
  allocator *in_stack_ffffffffffffff00;
  allocator *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  if (((int)in_RDI[10] != 2) && ((int)in_RDI[10] != 4)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Engine",&local_29);
    in_stack_ffffffffffffff08 = &local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"BP5Reader",in_stack_ffffffffffffff08);
    in_stack_ffffffffffffff00 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Init",in_stack_ffffffffffffff00);
    std::operator+((char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    helper::Throw<std::invalid_argument>
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  *(undefined1 *)(in_RDI[5] + 200) = 0;
  *(bool *)(in_RDI + 0xc5) = *(int *)(in_RDI[5] + 0x58) == 0;
  (**(code **)(*in_RDI + 0xb0))();
  (**(code **)(*in_RDI + 0xb8))();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    helper::RangeFilter::ParseSelection(in_stack_000003c0,in_stack_000003b8);
  }
  if ((*(byte *)((long)in_RDI + 0x621) & 1) != 0) {
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<float,void>
              ((duration<double,std::ratio<1l,1l>> *)&stack0xffffffffffffff48,
               (float *)(in_RDI + 0x2c));
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<float,void>
              ((duration<double,std::ratio<1l,1l>> *)&stack0xffffffffffffff40,
               (float *)((long)in_RDI + 0x164));
    std::chrono::operator>
              ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8);
    Now();
    std::chrono::operator+
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffff08,
               (duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff00);
    OpenFiles(in_stack_000006a0,in_stack_00000698,in_stack_00000690,in_stack_00000688);
    std::chrono::operator/
              ((duration<double,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff08,
               (int *)in_stack_ffffffffffffff00);
    UpdateBuffer(in_stack_00000550,in_stack_00000548,in_stack_00000540,in_stack_00000538);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      *(undefined1 *)(in_RDI + 0x8b) = 1;
    }
    pcVar2 = getenv("DoRemote");
    if ((pcVar2 != (char *)0x0) || (pcVar2 = getenv("DoXRootD"), pcVar2 != (char *)0x0)) {
      *(undefined1 *)(in_RDI + 0x8b) = 1;
    }
  }
  return;
}

Assistant:

void BP5Reader::Init()
{
    if ((m_OpenMode != Mode::Read) && (m_OpenMode != Mode::ReadRandomAccess))
    {
        helper::Throw<std::invalid_argument>("Engine", "BP5Reader", "Init",
                                             "BPFileReader only supports OpenMode::Read or "
                                             "OpenMode::ReadRandomAccess from" +
                                                 m_Name);
    }

    // if IO was involved in reading before this flag may be true now
    m_IO.m_ReadStreaming = false;
    m_ReaderIsRowMajor = (m_IO.m_ArrayOrder == ArrayOrdering::RowMajor);
    InitParameters();
    InitTransports();
    if (!m_Parameters.SelectSteps.empty())
    {
        m_SelectedSteps.ParseSelection(m_Parameters.SelectSteps);
    }

    if (m_ReadMetadataFromFile)
    {
        /* Do a collective wait for the file(s) to appear within timeout.
           Make sure every process comes to the same conclusion */
        const Seconds timeoutSeconds = Seconds(m_Parameters.OpenTimeoutSecs);

        Seconds pollSeconds = Seconds(m_Parameters.BeginStepPollingFrequencySecs);
        if (pollSeconds > timeoutSeconds)
        {
            pollSeconds = timeoutSeconds;
        }

        TimePoint timeoutInstant = Now() + timeoutSeconds;
        OpenFiles(timeoutInstant, pollSeconds, timeoutSeconds);
        UpdateBuffer(timeoutInstant, pollSeconds / 10, timeoutSeconds);

        // Don't try to open the remote file when we open local metadata.  Do that on demand.
        if (!m_Parameters.RemoteDataPath.empty())
            m_dataIsRemote = true;
        if (getenv("DoRemote") || getenv("DoXRootD"))
            m_dataIsRemote = true;
    }
}